

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::Explicit_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::Explicit_const&> *this,Explicit *rhs)

{
  int iVar1;
  int iVar2;
  Explicit *value;
  ostream *poVar3;
  ostringstream os;
  allocator local_289;
  long *local_288;
  size_type local_280;
  long local_278;
  undefined8 uStack_270;
  undefined1 *local_268;
  undefined8 local_260;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  string local_248;
  undefined1 *local_228;
  undefined8 local_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  long *local_208;
  size_type local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  string local_1e8;
  undefined1 local_1c8 [40];
  ostringstream local_1a0 [376];
  
  value = *(Explicit **)this;
  iVar2 = value->x;
  iVar1 = rhs->x;
  std::__cxx11::string::string((string *)&local_268,"==",&local_289);
  local_228 = local_218;
  if (local_268 == local_258) {
    uStack_210 = uStack_250;
  }
  else {
    local_228 = local_268;
  }
  local_220 = local_260;
  local_260 = 0;
  local_258[0] = 0;
  local_268 = local_258;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string<(anonymous_namespace)::Explicit>(&local_248,value);
  poVar3 = std::operator<<((ostream *)local_1a0,(string *)&local_248);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3," ");
  to_string<(anonymous_namespace)::Explicit>(&local_1e8,rhs);
  std::operator<<(poVar3,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p == &local_248.field_2) {
    uStack_270 = local_248.field_2._8_8_;
    local_288 = &local_278;
  }
  else {
    local_288 = (long *)local_248._M_dataplus._M_p;
  }
  local_278._1_7_ = local_248.field_2._M_allocated_capacity._1_7_;
  local_280 = local_248._M_string_length;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  local_200 = local_280;
  local_208 = &local_1f8;
  if (local_288 == &local_278) {
    uStack_1f0 = uStack_270;
  }
  else {
    local_208 = local_288;
  }
  local_280 = 0;
  local_278 = (ulong)local_278._1_7_ << 8;
  local_288 = &local_278;
  local_1c8[0] = iVar2 == iVar1;
  std::__cxx11::string::string((string *)(local_1c8 + 8),(string *)&local_208);
  result::result(__return_storage_ptr__,(result *)local_1c8);
  std::__cxx11::string::~string((string *)(local_1c8 + 8));
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_268);
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }